

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_injection(_Mem *mem,double n)

{
  Fact *this;
  DebugStream *this_00;
  uint64_t uVar1;
  allocator local_99;
  string local_98 [39];
  string local_71;
  uint64_t local_70;
  uint64_t t2;
  uint64_t t1;
  View *view;
  Fact *local_48;
  Code *fact;
  uint64_t now;
  Code *object;
  double i;
  uint64_t t0;
  Code *rstdin;
  double n_local;
  _Mem *mem_local;
  
  rstdin = (Code *)n;
  n_local = (double)mem;
  t0 = r_exec::_Mem::get_stdin();
  i = (double)(*r_exec::Now)();
  object = (Code *)0x0;
  while( true ) {
    if ((double)rstdin <= (double)object) break;
    uVar1 = t0;
    now = (uint64_t)make_object((_Mem *)n_local,(Code *)t0,(double)object);
    fact = (Code *)(*r_exec::Now)();
    this = (Fact *)r_exec::Fact::operator_new((Fact *)0x150,uVar1);
    r_exec::Fact::Fact(this,(Code *)now,(ulong)fact,(ulong)fact,1.0,1.0);
    local_48 = this;
    t1 = (uint64_t)build_view((uint64_t)fact,(Code *)t0);
    r_exec::View::set_object((Code *)t1);
    r_exec::_Mem::inject((View *)n_local);
    object = (Code *)((double)object + 1.0);
  }
  t2 = (*r_exec::Now)();
  local_70 = t2 - (long)i;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"main",&local_99);
  debug(&local_71);
  this_00 = DebugStream::operator<<((DebugStream *)&local_71,"for-loop total time: ");
  DebugStream::operator<<(this_00,local_70);
  DebugStream::~DebugStream((DebugStream *)&local_71);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  return;
}

Assistant:

void test_injection(r_exec::_Mem *mem, double n)
{
    Code* rstdin = mem->get_stdin();
    // mem->timings_report.clear();
    // uint64_t tt1 = 0;
    // uint64_t tt2 = 0;
    // uint64_t tt3 = 0;
    // uint64_t tt4 = 0;
    // std::vector<uint64> v1, v2, v3, v4;
    // v1.reserve(n);
    // v2.reserve(n);
    // v3.reserve(n);
    // v4.reserve(n);
    uint64_t t0 = r_exec::Now();

    for (double i = 0; i < n; ++i) {
        // tt1 = r_exec::Now();
        Code* object = make_object(mem, rstdin, i);
        uint64_t now = r_exec::Now();
        // v1.push_back(now - tt1);
        // Build a fact.
        // tt2 = now;
        Code *fact = new r_exec::Fact(object, now, now, 1, 1);
        // uint64_t tt = r_exec::Now();
        // v2.push_back(tt - tt2);
        // Build a default view for the fact.
        // tt3 = tt;
        r_exec::View *view = build_view(now, rstdin);
        // tt = r_exec::Now();
        // v3.push_back(tt - tt3);
        // Inject the view.
        // tt4 = tt;
        view->set_object(fact);
        mem->inject(view);
        // v4.push_back(r_exec::Now() - tt4);
    }

    uint64_t t1 = r_exec::Now();
    uint64_t t2 = t1 - t0;
    debug("main") << "for-loop total time: " << t2;
    /* uint64_t acc=0;
    for(uint64_t i=0;i<n;++i){
    acc+=v1[i];
    std::cout<<v1[i]<<'\t';
    }
    std::cout<<"\nfor-loop accumulated time make_object: "<<acc<< std::endl;
    acc=0;
    for(uint64_t i=0;i<n;++i){
    acc+=v2[i];
    // std::cout<<v2[i]<<'/'<<mem->timings_report[i]<<'\t';
    std::cout<<v2[i]<<'\t';
    }
    std::cout<<"\nfor-loop accumulated time new Fact : "<<acc<< std::endl;
    acc=0;
    for(uint64_t i=0;i<n;++i){
    acc+=v3[i];
    std::cout<<v3[i]<<'\t';
    }
    std::cout<<"\nfor-loop accumulated time build_view : "<<acc<< std::endl;
    acc=0;
    for(uint64_t i=0;i<n;++i){
    acc+=v4[i];
    std::cout<<v4[i]<<'\t';
    }
    std::cout<<"\nfor-loop accumulated time mem->inject: "<<acc<< std::endl;
    */
}